

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double deranged_mean(int a)

{
  int x;
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (-1 < a) {
    x = 0;
    dVar3 = 0.0;
    dVar1 = 0.0;
    do {
      dVar2 = deranged_pdf(x,a);
      dVar1 = dVar1 + dVar2 * dVar3;
      dVar3 = dVar3 + 1.0;
      x = x + 1;
    } while (a + 1 != x);
    return dVar1;
  }
  return 0.0;
}

Assistant:

double deranged_mean ( int a )

//****************************************************************************80
//
//  Purpose:
//
//    DERANGED_MEAN returns the mean of the Deranged CDF.
//
//  Discussion:
//
//    The mean is computed by straightforward summation.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the number of items.
//    1 <= A.
//
//    Output, double MEAN, the mean of the PDF.
//
{
  double mean;
  double pdf;
  int x;

  mean = 0.0;
  for ( x = 0; x <= a; x++ )
  {
    pdf = deranged_pdf ( x, a );
    mean = mean + pdf * x;
  }

  return mean;
}